

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

void __thiscall QColumnView::selectAll(QColumnView *this)

{
  int iVar1;
  int iVar2;
  QAbstractItemModel *pQVar3;
  QItemSelectionModel *pQVar4;
  qsizetype qVar5;
  const_reference pQVar6;
  ulong uVar7;
  QModelIndex *bottomR;
  long in_FS_OFFSET;
  QModelIndex br;
  QModelIndex tl;
  QItemSelection selection;
  QModelIndex parent;
  QModelIndexList indexList;
  undefined4 in_stack_fffffffffffffef8;
  SelectionFlag in_stack_fffffffffffffefc;
  QModelIndex *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  QModelIndex *in_stack_ffffffffffffff10;
  undefined4 local_d4;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_80;
  undefined1 *local_78;
  QAbstractItemModel *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  QAbstractItemModel *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  QAbstractItemModel *local_28;
  QList<QModelIndex> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QAbstractItemView::model((QAbstractItemView *)in_stack_ffffffffffffff10);
  if ((pQVar3 != (QAbstractItemModel *)0x0) &&
     (pQVar4 = QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_ffffffffffffff00),
     pQVar4 != (QItemSelectionModel *)0x0)) {
    local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_ffffffffffffff00);
    QItemSelectionModel::selectedIndexes();
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemView::rootIndex((QAbstractItemView *)in_stack_ffffffffffffff00);
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    QItemSelection::QItemSelection((QItemSelection *)0x865bfb);
    qVar5 = QList<QModelIndex>::size(&local_20);
    if (0 < qVar5) {
      QList<QModelIndex>::at
                ((QList<QModelIndex> *)in_stack_ffffffffffffff00,
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      QModelIndex::parent(in_stack_ffffffffffffff10);
      local_38 = local_68;
      local_30 = local_60;
      local_28 = local_58;
    }
    qVar5 = QList<QModelIndex>::size(&local_20);
    if (qVar5 == 1) {
      pQVar6 = QList<QModelIndex>::at
                         ((QList<QModelIndex> *)in_stack_ffffffffffffff00,
                          CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      local_38 = *(undefined1 **)pQVar6;
      local_30 = (undefined1 *)pQVar6->i;
      local_28 = (pQVar6->m).ptr;
      pQVar3 = QAbstractItemView::model((QAbstractItemView *)in_stack_ffffffffffffff10);
      uVar7 = (**(code **)(*(long *)pQVar3 + 0x88))(pQVar3,&local_38);
      if ((uVar7 & 1) == 0) {
        QModelIndex::parent(in_stack_ffffffffffffff10);
        local_38 = local_80;
        local_30 = local_78;
        local_28 = local_70;
      }
      else {
        QItemSelectionRange::QItemSelectionRange
                  ((QItemSelectionRange *)in_stack_ffffffffffffff10,
                   (QModelIndex *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                   in_stack_ffffffffffffff00);
        QList<QItemSelectionRange>::append
                  ((QList<QItemSelectionRange> *)in_stack_ffffffffffffff00,
                   (rvalue_ref)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)in_stack_ffffffffffffff00);
      }
    }
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    local_a0 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = QAbstractItemView::model((QAbstractItemView *)in_stack_ffffffffffffff10);
    (**(code **)(*(long *)pQVar3 + 0x60))(&local_a8,pQVar3,0,0,&local_38);
    local_c0 = &DAT_aaaaaaaaaaaaaaaa;
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    local_b0 = &DAT_aaaaaaaaaaaaaaaa;
    bottomR = (QModelIndex *)
              QAbstractItemView::model((QAbstractItemView *)in_stack_ffffffffffffff10);
    pQVar3 = QAbstractItemView::model((QAbstractItemView *)in_stack_ffffffffffffff10);
    iVar1 = (**(code **)(*(long *)pQVar3 + 0x78))(pQVar3,&local_38);
    iVar1 = iVar1 + -1;
    pQVar3 = QAbstractItemView::model((QAbstractItemView *)in_stack_ffffffffffffff10);
    iVar2 = (**(code **)(*(long *)pQVar3 + 0x80))(pQVar3,&local_38);
    (**(code **)(*(long *)bottomR + 0x60))(&local_c0,bottomR,iVar1,iVar2 + -1,&local_38);
    QItemSelectionRange::QItemSelectionRange
              ((QItemSelectionRange *)in_stack_ffffffffffffff10,
               (QModelIndex *)CONCAT44(iVar1,in_stack_ffffffffffffff08),bottomR);
    QList<QItemSelectionRange>::append
              ((QList<QItemSelectionRange> *)bottomR,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)bottomR);
    pQVar4 = QAbstractItemView::selectionModel((QAbstractItemView *)bottomR);
    QFlags<QItemSelectionModel::SelectionFlag>::QFlags
              ((QFlags<QItemSelectionModel::SelectionFlag> *)bottomR,in_stack_fffffffffffffefc);
    (**(code **)(*(long *)pQVar4 + 0x70))(pQVar4,&local_50,local_d4);
    QItemSelection::~QItemSelection((QItemSelection *)0x865e94);
    QList<QModelIndex>::~QList((QList<QModelIndex> *)0x865ea1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColumnView::selectAll()
{
    if (!model() || !selectionModel())
        return;

    QModelIndexList indexList = selectionModel()->selectedIndexes();
    QModelIndex parent = rootIndex();
    QItemSelection selection;
    if (indexList.size() >= 1)
        parent = indexList.at(0).parent();
    if (indexList.size() == 1) {
        parent = indexList.at(0);
        if (!model()->hasChildren(parent))
            parent = parent.parent();
        else
            selection.append(QItemSelectionRange(parent, parent));
    }

    QModelIndex tl = model()->index(0, 0, parent);
    QModelIndex br = model()->index(model()->rowCount(parent) - 1,
                                    model()->columnCount(parent) - 1,
                                    parent);
    selection.append(QItemSelectionRange(tl, br));
    selectionModel()->select(selection, QItemSelectionModel::ClearAndSelect);
}